

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void EDCircles::jacobi(double **a,int n,double *d,double **v,int nrot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  ulong uVar5;
  void *__s;
  void *__s_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double *z;
  double *b;
  double c;
  double g;
  double h;
  double s;
  double sm;
  double t;
  double tau;
  double theta;
  double tresh;
  int local_38;
  int i;
  int ip;
  int iq;
  int j;
  int nrot_local;
  double **v_local;
  double *d_local;
  int n_local;
  double **a_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(n + 1);
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(n + 1);
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s_00 = operator_new__(uVar5);
  memset(__s,0,(long)(n + 1) << 3);
  memset(__s_00,0,(long)(n + 1) << 3);
  for (local_38 = 1; local_38 <= n; local_38 = local_38 + 1) {
    for (i = 1; i <= n; i = i + 1) {
      v[local_38][i] = 0.0;
    }
    v[local_38][local_38] = 1.0;
  }
  for (local_38 = 1; local_38 <= n; local_38 = local_38 + 1) {
    dVar6 = a[local_38][local_38];
    d[local_38] = dVar6;
    *(double *)((long)__s + (long)local_38 * 8) = dVar6;
    *(undefined8 *)((long)__s_00 + (long)local_38 * 8) = 0;
  }
  tresh._4_4_ = 1;
  while( true ) {
    if (0x32 < tresh._4_4_) {
      if (__s != (void *)0x0) {
        operator_delete__(__s);
      }
      if (__s_00 != (void *)0x0) {
        operator_delete__(__s_00);
      }
      return;
    }
    s = 0.0;
    for (local_38 = 1; i = local_38, local_38 <= n + -1; local_38 = local_38 + 1) {
      while (i = i + 1, i <= n) {
        s = ABS(a[local_38][i]) + s;
      }
    }
    if ((s == 0.0) && (!NAN(s))) break;
    if (tresh._4_4_ < 4) {
      theta = (s * 0.2) / (double)(n * n);
    }
    else {
      theta = 0.0;
    }
    for (local_38 = 1; iVar4 = local_38, local_38 <= n + -1; local_38 = local_38 + 1) {
      while (iVar3 = iVar4, i = iVar3 + 1, i <= n) {
        dVar6 = ABS(a[local_38][i]) * 100.0;
        if (((tresh._4_4_ < 5) || (dVar6 != 0.0)) || (NAN(dVar6))) {
          iVar4 = i;
          if (theta < ABS(a[local_38][i])) {
            if ((dVar6 != 0.0) || (NAN(dVar6))) {
              dVar6 = ((d[i] - d[local_38]) * 0.5) / a[local_38][i];
              dVar7 = sqrt(dVar6 * dVar6 + 1.0);
              sm = 1.0 / (ABS(dVar6) + dVar7);
              if (dVar6 < 0.0) {
                sm = -sm;
              }
            }
            else {
              sm = a[local_38][i] / (d[i] - d[local_38]);
            }
            dVar6 = sqrt(sm * sm + 1.0);
            dVar7 = sm * (1.0 / dVar6);
            dVar6 = dVar7 / (1.0 / dVar6 + 1.0);
            dVar8 = sm * a[local_38][i];
            *(double *)((long)__s_00 + (long)local_38 * 8) =
                 *(double *)((long)__s_00 + (long)local_38 * 8) - dVar8;
            *(double *)((long)__s_00 + (long)i * 8) =
                 dVar8 + *(double *)((long)__s_00 + (long)i * 8);
            d[local_38] = d[local_38] - dVar8;
            d[i] = dVar8 + d[i];
            a[local_38][i] = 0.0;
            for (ip = 1; iVar4 = local_38, ip <= local_38 + -1; ip = ip + 1) {
              ROTATE(a,ip,local_38,ip,i,dVar6,dVar7);
            }
            while (ip = iVar4 + 1, ip <= iVar3) {
              ROTATE(a,local_38,ip,ip,i,dVar6,dVar7);
              iVar4 = ip;
            }
            for (ip = iVar3 + 2; ip <= n; ip = ip + 1) {
              ROTATE(a,local_38,ip,i,ip,dVar6,dVar7);
            }
            for (ip = 1; iVar4 = i, ip <= n; ip = ip + 1) {
              ROTATE(v,ip,local_38,ip,i,dVar6,dVar7);
            }
          }
        }
        else {
          a[local_38][i] = 0.0;
          iVar4 = i;
        }
      }
    }
    for (local_38 = 1; local_38 <= n; local_38 = local_38 + 1) {
      *(double *)((long)__s + (long)local_38 * 8) =
           *(double *)((long)__s_00 + (long)local_38 * 8) +
           *(double *)((long)__s + (long)local_38 * 8);
      d[local_38] = *(double *)((long)__s + (long)local_38 * 8);
      *(undefined8 *)((long)__s_00 + (long)local_38 * 8) = 0;
    }
    tresh._4_4_ = tresh._4_4_ + 1;
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  if (__s_00 == (void *)0x0) {
    return;
  }
  operator_delete__(__s_00);
  return;
}

Assistant:

void EDCircles::jacobi(double ** a, int n, double d[], double ** v, int nrot)
{
	int j, iq, ip, i;
	double tresh, theta, tau, t, sm, s, h, g, c;

	double *b = new double[n + 1];
	double *z = new double[n + 1];
	memset(b, 0, sizeof(double)*(n + 1));
	memset(z, 0, sizeof(double)*(n + 1));

	for (ip = 1; ip <= n; ip++)
	{
		for (iq = 1; iq <= n; iq++) v[ip][iq] = 0.0;
		v[ip][ip] = 1.0;
	}
	for (ip = 1; ip <= n; ip++)
	{
		b[ip] = d[ip] = a[ip][ip];
		z[ip] = 0.0;
	}
	nrot = 0;
	for (i = 1; i <= 50; i++)
	{
		sm = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
				sm += fabs(a[ip][iq]);
		}
		if (sm == 0.0)
		{
			delete[] b;
			delete[] z;
			return;
		}
		if (i < 4)
			tresh = 0.2 * sm / (n * n);
		else
			tresh = 0.0;
		for (ip = 1; ip <= n - 1; ip++)
		{
			for (iq = ip + 1; iq <= n; iq++)
			{
				g = 100.0 * fabs(a[ip][iq]);
				//				if (i > 4 && fabs(d[ip]) + g == fabs(d[ip])
				//				&& fabs(d[iq]) + g == fabs(d[iq]))

				if (i > 4 && g == 0.0)
					a[ip][iq] = 0.0;
				else if (fabs(a[ip][iq]) > tresh)
				{
					h = d[iq] - d[ip];
					if (g == 0.0)
						t = (a[ip][iq]) / h;
					else
					{
						theta = 0.5 * h / (a[ip][iq]);
						t = 1.0 / (fabs(theta) + sqrt(1.0 + theta * theta));
						if (theta < 0.0) t = -t;
					}
					c = 1.0 / sqrt(1 + t * t);
					s = t * c;
					tau = s / (1.0 + c);
					h = t * a[ip][iq];
					z[ip] -= h;
					z[iq] += h;
					d[ip] -= h;
					d[iq] += h;
					a[ip][iq] = 0.0;
					for (j = 1; j <= ip - 1; j++)
					{
						ROTATE(a, j, ip, j, iq, tau, s);
					}
					for (j = ip + 1; j <= iq - 1; j++)
					{
						ROTATE(a, ip, j, j, iq, tau, s);
					}
					for (j = iq + 1; j <= n; j++)
					{
						ROTATE(a, ip, j, iq, j, tau, s);
					}
					for (j = 1; j <= n; j++)
					{
						ROTATE(v, j, ip, j, iq, tau, s);
					}
					++nrot;
				}
			}
		}
		for (ip = 1; ip <= n; ip++)
		{
			b[ip] += z[ip];
			d[ip] = b[ip];
			z[ip] = 0.0;
		}
	}
	//printf("Too many iterations in routine JACOBI");
	delete[] b;
	delete[] z;
}